

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pssw.c
# Opt level: O2

parasail_result_ssw_t *
parasail_ssw_profile(parasail_profile_t *profile,char *s2,int s2Len_,int open,int gap)

{
  char *s;
  parasail_matrix_t *matrix;
  void *pvVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  parasail_result_t *result;
  char *s1;
  char *s2_00;
  parasail_result_t *result_00;
  parasail_result_t *result_01;
  parasail_cigar_t *__ptr;
  parasail_result_ssw_t *ppVar7;
  int iVar8;
  size_t length;
  long lVar9;
  int iVar10;
  size_t length_00;
  long lVar11;
  
  s = profile->s1;
  matrix = profile->matrix;
  pvVar1 = (profile->profile16).score;
  if ((profile->profile8).score == (void *)0x0) {
LAB_00457107:
    result = (parasail_result_t *)0x0;
    bVar2 = false;
  }
  else {
    result = parasail_sw_striped_profile_8(profile,s2,s2Len_,open,gap);
    iVar4 = parasail_result_is_saturated(result);
    if (iVar4 != 0) {
      parasail_result_free(result);
      goto LAB_00457107;
    }
    bVar2 = true;
  }
  if (result == (parasail_result_t *)0x0 && pvVar1 != (void *)0x0) {
    result = parasail_sw_striped_profile_16(profile,s2,s2Len_,open,gap);
    iVar4 = parasail_result_is_saturated(result);
    if (iVar4 != 0) goto LAB_004573ee;
  }
  if (result == (parasail_result_t *)0x0) {
    return (parasail_result_ssw_t *)0x0;
  }
  length = (long)result->end_query + 1;
  length_00 = (long)result->end_ref + 1;
  s1 = parasail_reverse(s,length);
  s2_00 = parasail_reverse(s2,length_00);
  bVar3 = true;
  iVar4 = (int)length;
  iVar8 = (int)length_00;
  if (bVar2) {
    result_00 = parasail_sw_striped_8(s1,iVar4,s2_00,iVar8,open,gap,matrix);
    iVar5 = parasail_result_is_saturated(result_00);
    if (iVar5 != 0) {
      parasail_result_free(result_00);
      goto LAB_004571dc;
    }
    bVar3 = false;
  }
  else {
LAB_004571dc:
    result_00 = (parasail_result_t *)0x0;
  }
  if (result_00 == (parasail_result_t *)0x0 && pvVar1 != (void *)0x0) {
    result_00 = parasail_sw_striped_16(s1,iVar4,s2_00,iVar8,open,gap,matrix);
    iVar4 = parasail_result_is_saturated(result_00);
    if (iVar4 != 0) {
      parasail_result_free(result_00);
      result_00 = (parasail_result_t *)0x0;
    }
  }
  free(s2_00);
  free(s1);
  if (result_00 == (parasail_result_t *)0x0) goto LAB_004573ee;
  lVar11 = (long)result->end_query - (long)result_00->end_query;
  lVar9 = (long)result->end_ref - (long)result_00->end_ref;
  iVar4 = result_00->end_query + 1;
  iVar8 = result_00->end_ref + 1;
  if (bVar3) {
    result_01 = (parasail_result_t *)0x0;
  }
  else {
    result_01 = parasail_sw_trace_striped_8(s + lVar11,iVar4,s2 + lVar9,iVar8,open,gap,matrix);
    iVar5 = parasail_result_is_saturated(result_01);
    if (iVar5 != 0) {
      parasail_result_free(result_01);
      result_01 = (parasail_result_t *)0x0;
    }
  }
  iVar10 = (int)lVar11;
  iVar5 = (int)lVar9;
  if (result_01 == (parasail_result_t *)0x0 && pvVar1 != (void *)0x0) {
    result_01 = parasail_sw_trace_striped_16(s + iVar10,iVar4,s2 + iVar5,iVar8,open,gap,matrix);
    iVar6 = parasail_result_is_saturated(result_01);
    if (iVar6 == 0) goto LAB_0045735c;
    parasail_result_free(result_01);
  }
  else {
LAB_0045735c:
    if (result_01 != (parasail_result_t *)0x0) {
      __ptr = parasail_result_get_cigar(result_01,s + iVar10,iVar4,s2 + iVar5,iVar8,matrix);
      ppVar7 = (parasail_result_ssw_t *)malloc(0x28);
      ppVar7->score1 = (uint16_t)result->score;
      ppVar7->ref_begin1 = iVar5;
      ppVar7->ref_end1 = result->end_ref;
      ppVar7->read_begin1 = iVar10;
      ppVar7->read_end1 = result->end_query;
      ppVar7->cigar = __ptr->seq;
      ppVar7->cigarLen = __ptr->len;
      free(__ptr);
      parasail_result_free(result_01);
      parasail_result_free(result_00);
      parasail_result_free(result);
      return ppVar7;
    }
  }
  parasail_result_free(result_00);
LAB_004573ee:
  parasail_result_free(result);
  return (parasail_result_ssw_t *)0x0;
}

Assistant:

parasail_result_ssw_t* parasail_ssw_profile(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len_,
        const int open, const int gap)
{
    const char *s1 = profile->s1;
    const parasail_matrix_t *matrix = profile->matrix;
    parasail_result_t *result_forward = NULL;
    parasail_result_t *result_reverse = NULL;
    parasail_result_t *result_final = NULL;
    parasail_result_ssw_t *result_ssw = NULL;
    int has8 = 0;
    int has16 = 0;
    char *s1_reverse = NULL;
    char *s2_reverse = NULL;
    int s1Len = 0;
    int s2Len = 0;
    int s1Off = 0;
    int s2Off = 0;
    parasail_cigar_t *cigar = NULL;

    /* find the end loc first with the faster implementation */
    has8 = (NULL != profile->profile8.score);
    has16 = (NULL != profile->profile16.score);

    /* find the end loc first with the faster implementation */
    if (has8) {
        result_forward = parasail_sw_striped_profile_8(profile, s2, s2Len_, open, gap);
        if (parasail_result_is_saturated(result_forward)) {
            has8 = 0;
            parasail_result_free(result_forward);
            result_forward = NULL;
        }
    }
    if (NULL == result_forward && has16) {
        result_forward = parasail_sw_striped_profile_16(profile, s2, s2Len_, open, gap);
        if (parasail_result_is_saturated(result_forward)) {
            parasail_result_free(result_forward);
            result_forward = NULL;
        }
    }
    /* 8- and/or 16-bit options could fail */
    if (NULL == result_forward) {
        return NULL;
    }

    /* find beginning loc by going in reverse */
    s1Len = result_forward->end_query+1;
    s2Len = result_forward->end_ref+1;
    s1_reverse = parasail_reverse(s1, s1Len);
    s2_reverse = parasail_reverse(s2, s2Len);
    if (has8) {
        result_reverse = parasail_sw_striped_8(
                s1_reverse, s1Len,
                s2_reverse, s2Len,
                open, gap, matrix);
        if (parasail_result_is_saturated(result_reverse)) {
            has8 = 0;
            parasail_result_free(result_reverse);
            result_reverse = NULL;
        }
    }
    if (NULL == result_reverse && has16) {
        result_reverse = parasail_sw_striped_16(
                s1_reverse, s1Len,
                s2_reverse, s2Len,
                open, gap, matrix);
        if (parasail_result_is_saturated(result_reverse)) {
            parasail_result_free(result_reverse);
            result_reverse = NULL;
        }
    }
    free(s2_reverse);
    free(s1_reverse);

    /* 8- and/or 16-bit options could fail */
    if (NULL == result_reverse) {
        parasail_result_free(result_forward); /* free the forward result */
        return NULL;
    }

    /* run trace version of sw on just the aligned portion */
    s1Off = result_forward->end_query - result_reverse->end_query;
    s2Off = result_forward->end_ref - result_reverse->end_ref;
    s1Len = result_reverse->end_query+1;
    s2Len = result_reverse->end_ref+1;
    if (has8) {
        result_final = parasail_sw_trace_striped_8(
                &s1[s1Off], s1Len,
                &s2[s2Off], s2Len,
                open, gap, matrix);
        if (parasail_result_is_saturated(result_final)) {
            has8 = 0;
            parasail_result_free(result_final);
            result_final = NULL;
        }
    }
    if (NULL == result_final && has16) {
        result_final = parasail_sw_trace_striped_16(
                &s1[s1Off], s1Len,
                &s2[s2Off], s2Len,
                open, gap, matrix);
        if (parasail_result_is_saturated(result_final)) {
            parasail_result_free(result_final);
            result_final = NULL;
        }
    }

    /* 8- and/or 16-bit options could fail */
    if (NULL == result_final) {
        parasail_result_free(result_reverse); /* free reverse result */
        parasail_result_free(result_forward); /* free forward result */
        return NULL;
    }

    /* get cigar from traceback */
    cigar = parasail_result_get_cigar(result_final,
            &s1[s1Off], s1Len,
            &s2[s2Off], s2Len,
            matrix);

    result_ssw = (parasail_result_ssw_t*)malloc(sizeof(parasail_result_ssw_t));
    result_ssw->score1 = result_forward->score;
    result_ssw->ref_begin1 = s2Off;
    result_ssw->ref_end1 = result_forward->end_ref;
    result_ssw->read_begin1 = s1Off;
    result_ssw->read_end1 = result_forward->end_query;
    result_ssw->cigar = cigar->seq;
    result_ssw->cigarLen = cigar->len;

    free(cigar);
    parasail_result_free(result_final);
    parasail_result_free(result_reverse);
    parasail_result_free(result_forward);

    return result_ssw;;
}